

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::Switch::sizeHint(Switch *this)

{
  SwitchPrivate *pSVar1;
  int iVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar4;
  QSize QVar5;
  QStyleOption opt;
  QStyleOption local_60 [32];
  QString local_40;
  
  QStyleOption::QStyleOption(local_60,1,0);
  QStyleOption::initFrom((QWidget *)local_60);
  iVar2 = QFontMetrics::ascent();
  pSVar1 = (this->d).d;
  pSVar1->radius = iVar2;
  iVar2 = 0;
  iVar3 = 0;
  if ((pSVar1->offText).d.size != 0) {
    iVar3 = QFontMetrics::boundingRect(&local_40);
    iVar3 = (extraout_EDX - iVar3) + 1;
  }
  if ((((this->d).d)->onText).d.size != 0) {
    iVar2 = QFontMetrics::boundingRect(&local_40);
    iVar2 = (extraout_EDX_00 - iVar2) + 1;
  }
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  pSVar1 = (this->d).d;
  pSVar1->textWidth = iVar2;
  iVar3 = pSVar1->radius;
  iVar4 = iVar3 / 2 + iVar3 * 3 + iVar2;
  iVar2 = 0;
  if (AcceptedUncheck < pSVar1->state) {
    if (1 < pSVar1->state - NotAcceptedCheck) goto LAB_00170e4a;
    iVar2 = iVar4 + iVar3 * -2;
  }
  pSVar1->offset = iVar2;
LAB_00170e4a:
  QVar5.wd = iVar4 + 2;
  QStyleOption::~QStyleOption(local_60);
  QVar5.ht = iVar3 * 2 + 2;
  return QVar5;
}

Assistant:

QSize
Switch::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->radius = opt.fontMetrics.ascent();

	int offWidth = 0;
	int onWidth = 0;

	if( !d->offText.isEmpty() )
		offWidth = opt.fontMetrics.boundingRect( d->offText ).width();

	if( !d->onText.isEmpty() )
		onWidth = opt.fontMetrics.boundingRect( d->onText ).width();

	d->textWidth = qMax( offWidth, onWidth );

	const QRect r( 0, 0,
		d->textWidth + d->radius * 3 + d->radius / 2 + 2, d->radius * 2 + 2 );

	d->initOffset( r );

	return QSize( r.width(), r.height() );
}